

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxmatfx.cpp
# Opt level: O1

void * rw::xbox::matfxOpen(void *o,int32 param_2,int32 param_3)

{
  _DAT_00148ce0 = ObjPipeline::create();
  _DAT_00148ce0->instanceCB = defaultInstanceCB;
  _DAT_00148ce0->uninstanceCB = defaultUninstanceCB;
  (_DAT_00148ce0->super_ObjPipeline).super_Pipeline.pluginID = 0x120;
  (_DAT_00148ce0->super_ObjPipeline).super_Pipeline.pluginData = 0;
  return o;
}

Assistant:

static void*
matfxOpen(void *o, int32, int32)
{
	matFXGlobals.pipelines[PLATFORM_XBOX] = makeMatFXPipeline();
	return o;
}